

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calculator.h
# Opt level: O2

void __thiscall Calculator::Calculator(Calculator *this,String *e)

{
  String *ctx;
  
  ctx = e;
  asl::Array<Calculator::Token>::Array(&this->_input);
  asl::Array<Calculator::Token>::Array(&this->_output);
  asl::Array<Calculator::Token>::Array(&(this->_operators).super_Array<Calculator::Token>);
  asl::Array<double>::Array(&(this->_operands).super_Array<double>);
  asl::Array<asl::Map<asl::String,_double>::KeyVal>::Array
            ((Array<asl::Map<asl::String,_double>::KeyVal> *)&this->_variables);
  asl::Array<asl::Map<asl::String,_double_(*)(double)>::KeyVal>::Array
            ((Array<asl::Map<asl::String,_double_(*)(double)>::KeyVal> *)&this->_natfunctions);
  init(this,(EVP_PKEY_CTX *)ctx);
  parse(this,e);
  return;
}

Assistant:

Calculator(const asl::String& e) { init(); parse(e); }